

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O1

void __thiscall
TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapePoint>_>::ForcePrepareIntPtIndices
          (TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapePoint>_> *this)

{
  IntruleType *pIVar1;
  undefined1 auVar2 [16];
  int iVar3;
  uint uVar4;
  TPZMaterial *pTVar5;
  long *plVar6;
  long lVar7;
  IntruleType *pIVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  long lVar12;
  
  pTVar5 = TPZCompEl::Material((TPZCompEl *)this);
  if (pTVar5 == (TPZMaterial *)0x0) {
    plVar6 = (long *)0x0;
  }
  else {
    plVar6 = (long *)__dynamic_cast(pTVar5,&TPZMaterial::typeinfo,&TPZMatWithMemBase::typeinfo,
                                    0xfffffffffffffffe);
  }
  if (pTVar5 == (TPZMaterial *)0x0 || plVar6 == (long *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error at ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "virtual void TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapePoint>>::ForcePrepareIntPtIndices() [TBASE = TPZCompElH1<pzshape::TPZShapePoint>]"
               ,0x8c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," this->Material() == NULL\n",0x1a);
    return;
  }
  iVar3 = (**(code **)(*(long *)&(this->super_TPZCompElH1<pzshape::TPZShapePoint>).
                                 super_TPZIntelGen<pzshape::TPZShapePoint>.
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x180))(this);
  if (iVar3 != 0) {
    pIVar1 = (IntruleType *)
             (this->super_TPZCompElH1<pzshape::TPZShapePoint>).
             super_TPZIntelGen<pzshape::TPZShapePoint>.super_TPZInterpolatedElement.
             super_TPZInterpolationSpace.super_TPZCompEl.fIntegrationRule;
    pIVar8 = &(this->super_TPZCompElH1<pzshape::TPZShapePoint>).
              super_TPZIntelGen<pzshape::TPZShapePoint>.fIntRule;
    if (pIVar1 != (IntruleType *)0x0) {
      pIVar8 = pIVar1;
    }
    uVar4 = (*(pIVar8->super_TPZIntPoints)._vptr_TPZIntPoints[3])();
    TPZManVector<long,_128>::Resize
              (&(this->fIntPtIndices).super_TPZManVector<long,_128>,(long)(int)uVar4);
    if (((int)uVar4 < 1) || (gSinglePointMemory == false)) {
      if (0 < (int)uVar4) {
        uVar9 = 0;
        do {
          iVar3 = (**(code **)(*plVar6 + 0x58))(plVar6,0xffffffff);
          (this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>.fStore[uVar9] =
               (long)iVar3;
          uVar9 = uVar9 + 1;
        } while (uVar4 != uVar9);
      }
    }
    else {
      iVar3 = (**(code **)(*plVar6 + 0x58))(plVar6,0xffffffff);
      auVar2 = _DAT_014f8350;
      plVar6 = (this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>.fStore;
      lVar7 = (ulong)uVar4 - 1;
      auVar10._8_4_ = (int)lVar7;
      auVar10._0_8_ = lVar7;
      auVar10._12_4_ = (int)((ulong)lVar7 >> 0x20);
      lVar7 = 0;
      auVar10 = auVar10 ^ _DAT_014f8350;
      auVar11 = _DAT_014f8340;
      do {
        auVar13 = auVar11 ^ auVar2;
        if ((bool)(~(auVar13._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar13._0_4_ ||
                    auVar10._4_4_ < auVar13._4_4_) & 1)) {
          *(long *)((long)plVar6 + lVar7) = (long)iVar3;
        }
        if ((auVar13._12_4_ != auVar10._12_4_ || auVar13._8_4_ <= auVar10._8_4_) &&
            auVar13._12_4_ <= auVar10._12_4_) {
          *(long *)((long)plVar6 + lVar7 + 8) = (long)iVar3;
        }
        lVar12 = auVar11._8_8_;
        auVar11._0_8_ = auVar11._0_8_ + 2;
        auVar11._8_8_ = lVar12 + 2;
        lVar7 = lVar7 + 0x10;
      } while ((ulong)(uVar4 + 1 >> 1) << 4 != lVar7);
    }
  }
  return;
}

Assistant:

inline void TPZCompElWithMem<TBASE>::ForcePrepareIntPtIndices() {
    
    TPZMaterial * material = TBASE::Material();
    auto * matWithMem =
        dynamic_cast<TPZMatWithMemBase *>(material);
    if(!material || !matWithMem){
        PZError << "Error at " << __PRETTY_FUNCTION__ << " this->Material() == NULL\n";
        return;
    }
    
    if (this->NumberOfCompElementsInsideThisCompEl() == 0) {
        // This is suposed to happen if in the constructor of a multiphysics element. The CompEl vector is only initialized after the autobuild
        return;
    }
    
    const TPZIntPoints &intrule = TBASE::GetIntegrationRule();
    
    int intrulepoints = intrule.NPoints();
    
    fIntPtIndices.Resize(intrulepoints);
    
    if(gSinglePointMemory && intrulepoints > 0)
    {
        int64_t point_index = matWithMem->PushMemItem();
#ifdef PZDEBUG
        if(point_index < 0)
        {
            std::cout << __PRETTY_FUNCTION__ << " material has no memory interface\n";
        }
#endif
        for(int int_ind = 0; int_ind < intrulepoints; ++int_ind){
            fIntPtIndices[int_ind] = point_index;
            // Pushing a new entry in the material memory
        } //Loop over integratin points generating a reference vector of memory
    }
    else
    {
        for(int int_ind = 0; int_ind < intrulepoints; ++int_ind){
            fIntPtIndices[int_ind] = matWithMem->PushMemItem();
            // Pushing a new entry in the material memory
        } //Loop over integratin points generating a reference vector of memory
          //entries in the related pzmatwithmem for further use.
    }
    
}